

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

double getParaDescent(DoublePerlinNoise *para,double factor,int x,int z,int w,int h,int i0,int j0,
                     int maxrad,int maxiter,double alpha,void *data,
                     _func_int_void_ptr_int_int_double *func)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int c;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_c8;
  
  dVar11 = sampleDoublePerlin(para,(double)(i0 + x),0.0,(double)(j0 + z));
  dVar11 = dVar11 * factor;
  if ((func != (_func_int_void_ptr_int_int_double *)0x0) &&
     (iVar1 = (*func)(data,i0 + x,j0 + z,
                      (double)(~-(ulong)(factor < 0.0) & (ulong)dVar11 |
                              (ulong)-dVar11 & -(ulong)(factor < 0.0))), iVar1 != 0)) {
LAB_00110806:
    dVar11 = nan("");
    return dVar11;
  }
  uVar5 = 0;
  if (maxiter < 1) {
    maxiter = uVar5;
  }
  uVar10 = -(ulong)(factor < 0.0);
  uVar7 = 0;
  uVar8 = 0;
  iVar1 = j0;
  iVar9 = i0;
  do {
    if (uVar8 == maxiter) {
      return dVar11;
    }
    uVar5 = uVar5 + (uVar5 == 0);
    dVar12 = dVar11;
    if ((int)(iVar9 + uVar5) < w && -1 < (int)(iVar9 + uVar5)) {
      dVar12 = sampleDoublePerlin(para,(double)(int)(x + uVar5 + iVar9),0.0,(double)(z + iVar1));
      dVar12 = dVar12 * factor;
    }
    if (dVar12 < dVar11) {
LAB_00110932:
      uVar2 = (uint)((dVar11 - dVar12) * (double)(int)uVar5 * alpha);
      uVar4 = -uVar2;
      if (0 < (int)uVar2) {
        uVar4 = uVar2;
      }
      if ((uVar4 < 3) || (iVar6 = iVar9 + uVar2, w <= iVar6 || iVar6 < 0)) {
LAB_001109b6:
        iVar6 = iVar9 + uVar5;
        dVar11 = dVar12;
      }
      else {
        dVar13 = sampleDoublePerlin(para,(double)(int)(uVar2 + x + iVar9),0.0,(double)(z + iVar1));
        dVar11 = dVar13 * factor;
        if (dVar12 <= dVar13 * factor) goto LAB_001109b6;
      }
      iVar9 = iVar6;
      if ((func != (_func_int_void_ptr_int_int_double *)0x0) &&
         (iVar6 = (*func)(data,iVar6 + x,iVar1 + z,
                          (double)(~uVar10 & (ulong)dVar11 | (ulong)-dVar11 & uVar10)), iVar6 != 0))
      goto LAB_00110806;
    }
    else {
      dVar12 = dVar11;
      if ((int)(iVar9 - uVar5) < w && -1 < (int)(iVar9 - uVar5)) {
        dVar12 = sampleDoublePerlin(para,(double)(int)((x - uVar5) + iVar9),0.0,(double)(z + iVar1))
        ;
        dVar12 = dVar12 * factor;
      }
      if (dVar12 < dVar11) {
        uVar5 = -uVar5;
        goto LAB_00110932;
      }
      uVar5 = 0;
    }
    uVar7 = uVar7 + (uVar7 == 0);
    dVar12 = dVar11;
    if ((int)(iVar1 + uVar7) < h && -1 < (int)(iVar1 + uVar7)) {
      dVar12 = sampleDoublePerlin(para,(double)(x + iVar9),0.0,(double)(int)(z + uVar7 + iVar1));
      dVar12 = dVar12 * factor;
    }
    if (dVar12 < dVar11) {
LAB_00110afe:
      uVar2 = (uint)((dVar11 - dVar12) * (double)(int)uVar7 * alpha);
      uVar4 = -uVar2;
      if (0 < (int)uVar2) {
        uVar4 = uVar2;
      }
      if ((uVar4 < 3) || (iVar6 = iVar1 + uVar2, h <= iVar6 || iVar6 < 0)) {
LAB_00110b83:
        iVar6 = iVar1 + uVar7;
        local_c8 = dVar12;
      }
      else {
        dVar11 = sampleDoublePerlin(para,(double)(x + iVar9),0.0,(double)(int)(uVar2 + z + iVar1));
        local_c8 = dVar11 * factor;
        if (dVar12 <= dVar11 * factor) goto LAB_00110b83;
      }
      iVar1 = iVar6;
      if ((func != (_func_int_void_ptr_int_int_double *)0x0) &&
         (iVar6 = (*func)(data,iVar9 + x,iVar6 + z,
                          (double)(~uVar10 & (ulong)local_c8 | (ulong)-local_c8 & uVar10)),
         iVar6 != 0)) goto LAB_00110806;
    }
    else {
      dVar12 = dVar11;
      if ((int)(iVar1 - uVar7) < h && -1 < (int)(iVar1 - uVar7)) {
        dVar12 = sampleDoublePerlin(para,(double)(x + iVar9),0.0,(double)(int)((z - uVar7) + iVar1))
        ;
        dVar12 = dVar12 * factor;
      }
      if (dVar12 < dVar11) {
        uVar7 = -uVar7;
        goto LAB_00110afe;
      }
      uVar7 = 0;
      local_c8 = dVar11;
    }
    dVar11 = local_c8;
    iVar6 = iVar1;
    iVar3 = iVar9;
    if (uVar7 == 0 && uVar5 == 0) {
      uVar4 = 0;
      do {
        if (uVar4 == 4) {
          return local_c8;
        }
        uVar5 = -(uVar4 & 1) | 1;
        iVar3 = uVar5 + iVar9;
        if (iVar3 < w && -1 < iVar3) {
          uVar7 = (uVar4 < 2) - 1 | 1;
          iVar6 = uVar7 + iVar1;
          if (iVar6 < h && -1 < iVar6) {
            dVar12 = sampleDoublePerlin(para,(double)(int)(x + iVar9 + uVar5),0.0,
                                        (double)(int)(z + iVar1 + uVar7));
            dVar11 = dVar12 * factor;
            if (dVar12 * factor < local_c8) break;
          }
        }
        uVar4 = uVar4 + 1;
      } while( true );
    }
    iVar9 = iVar3;
    iVar3 = iVar9 - i0;
    iVar1 = -iVar3;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    if (maxrad < iVar1) {
      return dVar11;
    }
    uVar2 = iVar6 - j0;
    uVar4 = -uVar2;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
    uVar8 = uVar8 + 1;
    iVar1 = iVar6;
    if ((uint)maxrad < uVar4) {
      return dVar11;
    }
  } while( true );
}

Assistant:

double getParaDescent(const DoublePerlinNoise *para, double factor,
    int x, int z, int w, int h, int i0, int j0, int maxrad,
    int maxiter, double alpha, void *data, int (*func)(void*,int,int,double))
{
    /// Do a gradient descent on a grid...
    /// To start with, we will just consider a step size of 1 in one axis:
    ///   Try going in positive x: if gradient is upwards go to negative x
    ///   then do the same with z - if all 4 directions go upwards then we have
    ///   found a minimum, otherwise repeat.
    /// We can remember and try the direction from the previous cycle first to
    /// reduce the number of wrong guesses.
    ///
    /// We can also use a larger step size than 1, as long as we believe that
    /// the minimum is not in between. To determine if this is viable, we check
    /// the step size of 1 first, and then jump if the gradient appears large
    /// enough in that direction.
    ///
    ///TODO:
    /// The perlin noise can be sampled continuously, so more established
    /// minima algorithms can also be considered...

    int dirx = 0, dirz = 0, dira;
    int k, i, j;
    double v, vd, va;
    v = factor * sampleDoublePerlin(para, x+i0, 0, z+j0);
    if (func)
    {
        if (func(data, x+i0, z+j0, factor < 0 ? -v : v))
            return nan("");
    }

    i = i0; j = j0;
    for (k = 0; k < maxiter; k++)
    {
        if (dirx == 0) dirx = +1;
        if (i+dirx >= 0 && i+dirx < w)
            vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j);
        else vd = v;
        if (vd >= v)
        {
            dirx *= -1;
            if (i+dirx >= 0 && i+dirx < w)
                vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j);
            else vd = v;
            if (vd >= v)
                dirx = 0;
        }
        if (dirx)
        {
            dira = (int)(dirx * alpha * (v - vd));
            if (abs(dira) > 2 && i+dira >= 0 && i+dira < w)
            {   // try jumping by more than 1
                va = factor * sampleDoublePerlin(para, x+i+dira, 0, z+j);
                if (va < vd)
                {
                    i += dira;
                    v = va;
                    goto L_x_end;
                }
            }
            v = vd;
            i += dirx;
        L_x_end:
            if (func)
            {
                if (func(data, x+i, z+j, factor < 0 ? -v : v))
                    return nan("");
            }
        }

        if (dirz == 0) dirz = +1;
        if (j+dirz >= 0 && j+dirz < h)
            vd = factor * sampleDoublePerlin(para, x+i, 0, z+j+dirz);
        else vd = v;
        if (vd >= v)
        {
            dirz *= -1;
            if (j+dirz >= 0 && j+dirz < h)
                vd = factor * sampleDoublePerlin(para, x+i, 0, z+j+dirz);
            else vd = v;
            if (vd >= v)
                dirz = 0;
        }
        if (dirz)
        {
            dira = (int)(dirz * alpha * (v - vd));
            if (abs(dira) > 2 && j+dira >= 0 && j+dira < h)
            {   // try jumping by more than 1
                va = factor * sampleDoublePerlin(para, x+i, 0, z+j+dira);
                if (va < vd)
                {
                    j += dira;
                    v = va;
                    goto L_z_end;
                }
            }
            j += dirz;
            v = vd;
        L_z_end:
            if (func)
            {
                if (func(data, x+i, z+j, factor < 0 ? -v : v))
                    return nan("");
            }
        }
        if (dirx == 0 && dirz == 0)
        {   // this is very likely a fix point
            // but there could be a minimum along a diagonal path in rare cases
            int c;
            for (c = 0; c < 4; c++)
            {
                dirx = (c & 1) ? -1 : +1;
                dirz = (c & 2) ? -1 : +1;
                if (i+dirx < 0 || i+dirx >= w || j+dirz < 0 || j+dirz >= h)
                    continue;
                vd = factor * sampleDoublePerlin(para, x+i+dirx, 0, z+j+dirz);
                if (vd < v)
                {
                    v = vd;
                    i += dirx;
                    j += dirz;
                    break;
                }
            }
            if (c >= 4)
                break;
        }
        if (abs(i - i0) > maxrad || abs(j - j0) > maxrad)
            break; // we have gone too far from the origin
    }

    return v;
}